

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O2

ze_result_t
validation_layer::zeMemOpenIpcHandle
          (ze_context_handle_t hContext,ze_device_handle_t hDevice,ze_ipc_mem_handle_t handle,
          ze_ipc_memory_flags_t flags,void **pptr)

{
  Logger *this;
  long *plVar1;
  ze_result_t result;
  ze_result_t zVar2;
  long lVar3;
  size_t i;
  long lVar4;
  long lVar5;
  allocator local_61;
  void **local_60;
  code *local_58;
  string local_50;
  
  lVar5 = context;
  this = *(Logger **)(context + 0xd50);
  local_60 = pptr;
  std::__cxx11::string::string
            ((string *)&local_50,"zeMemOpenIpcHandle(hContext, hDevice, handle, flags, pptr)",
             &local_61);
  loader::Logger::log_trace(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (*(code **)(lVar5 + 0x3f0) == (code *)0x0) {
    result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar3 = *(long *)(lVar5 + 0xd38) - *(long *)(lVar5 + 0xd30) >> 3;
    lVar4 = 0;
    local_58 = *(code **)(lVar5 + 0x3f0);
    do {
      if (lVar3 == lVar4) {
        if ((*(char *)(context + 4) != '\x01') ||
           (result = ZEHandleLifetimeValidation::zeMemOpenIpcHandlePrologue
                               (*(ZEHandleLifetimeValidation **)(context + 0xd48),hContext,hDevice,
                                handle,flags,local_60), result == ZE_RESULT_SUCCESS)) {
          zVar2 = (*local_58)(hContext,hDevice,flags,local_60);
          lVar5 = 0;
          goto LAB_0015075b;
        }
        break;
      }
      plVar1 = (long *)**(undefined8 **)(*(long *)(context + 0xd30) + lVar4 * 8);
      result = (**(code **)(*plVar1 + 0x640))(plVar1,hContext,hDevice,flags,local_60);
      lVar4 = lVar4 + 1;
    } while (result == ZE_RESULT_SUCCESS);
  }
  goto LAB_001507c1;
  while( true ) {
    plVar1 = (long *)**(undefined8 **)(*(long *)(context + 0xd30) + lVar5 * 8);
    result = (**(code **)(*plVar1 + 0x648))
                       (plVar1,hContext,hDevice,flags,local_60,zVar2,handle.data._0_4_,
                        handle.data._8_4_,handle.data._16_4_,handle.data._24_4_,handle.data._32_4_,
                        handle.data._40_4_,handle.data._48_4_,handle.data._56_4_);
    lVar5 = lVar5 + 1;
    if (result != ZE_RESULT_SUCCESS) break;
LAB_0015075b:
    result = zVar2;
    if (lVar3 == lVar5) break;
  }
LAB_001507c1:
  logAndPropagateResult("zeMemOpenIpcHandle",result);
  return result;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeMemOpenIpcHandle(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        ze_device_handle_t hDevice,                     ///< [in] handle of the device to associate with the IPC memory handle
        ze_ipc_mem_handle_t handle,                     ///< [in] IPC memory handle
        ze_ipc_memory_flags_t flags,                    ///< [in] flags controlling the operation.
                                                        ///< must be 0 (default) or a valid combination of ::ze_ipc_memory_flag_t.
        void** pptr                                     ///< [out] pointer to device allocation in this process
        )
    {
        context.logger->log_trace("zeMemOpenIpcHandle(hContext, hDevice, handle, flags, pptr)");

        auto pfnOpenIpcHandle = context.zeDdiTable.Mem.pfnOpenIpcHandle;

        if( nullptr == pfnOpenIpcHandle )
            return logAndPropagateResult("zeMemOpenIpcHandle", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeMemOpenIpcHandlePrologue( hContext, hDevice, handle, flags, pptr );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeMemOpenIpcHandle", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zeHandleLifetime.zeMemOpenIpcHandlePrologue( hContext, hDevice, handle, flags, pptr );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeMemOpenIpcHandle", result);
        }

        auto driver_result = pfnOpenIpcHandle( hContext, hDevice, handle, flags, pptr );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeMemOpenIpcHandleEpilogue( hContext, hDevice, handle, flags, pptr ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeMemOpenIpcHandle", result);
        }

        return logAndPropagateResult("zeMemOpenIpcHandle", driver_result);
    }